

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

LoopDescriptor * __thiscall spvtools::opt::IRContext::GetLoopDescriptor(IRContext *this,Function *f)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
  _Var3;
  ulong uVar4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  pair<std::__detail::_Node_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false,_false>,_bool>
  pVar7;
  Function *local_218;
  LoopDescriptor local_210;
  LoopDescriptor local_118;
  
  if ((this->valid_analyses_ & kAnalysisLoopAnalysis) == kAnalysisNone) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>_>_>
    ::_M_deallocate_nodes
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>_>_>
                *)&this->loop_descriptors_,
               (__node_ptr)(this->loop_descriptors_)._M_h._M_before_begin._M_nxt);
    memset((this->loop_descriptors_)._M_h._M_buckets,0,
           (this->loop_descriptors_)._M_h._M_bucket_count << 3);
    (this->loop_descriptors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->loop_descriptors_)._M_h._M_element_count = 0;
    *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisLoopAnalysis;
  }
  uVar1 = (this->loop_descriptors_)._M_h._M_bucket_count;
  uVar4 = (ulong)f % uVar1;
  p_Var5 = (this->loop_descriptors_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Function *)p_Var5->_M_nxt[1]._M_nxt != f)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Function *)p_Var2[1]._M_nxt == f)) goto LAB_005d99da;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_005d99da:
  if (p_Var6 == (__node_base_ptr)0x0) {
    _Var3._M_cur = (__node_type *)0x0;
  }
  else {
    _Var3._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (_Var3._M_cur == (__node_type *)0x0) {
    LoopDescriptor::LoopDescriptor(&local_118,this,f);
    local_218 = f;
    LoopDescriptor::LoopDescriptor(&local_210,&local_118);
    pVar7 = std::
            _Hashtable<spvtools::opt::Function_const*,std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Function_const*>,std::hash<spvtools::opt::Function_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<spvtools::opt::Function_const*,spvtools::opt::LoopDescriptor>>
                      ((_Hashtable<spvtools::opt::Function_const*,std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::LoopDescriptor>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Function_const*>,std::hash<spvtools::opt::Function_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->loop_descriptors_,&local_218);
    _Var3._M_cur = (__node_type *)
                   pVar7.first.
                   super__Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
                   ._M_cur;
    LoopDescriptor::~LoopDescriptor(&local_210);
    LoopDescriptor::~LoopDescriptor(&local_118);
  }
  return (LoopDescriptor *)
         ((long)&((_Var3._M_cur)->
                 super__Hash_node_value<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>
                 ._M_storage._M_storage + 8);
}

Assistant:

LoopDescriptor* IRContext::GetLoopDescriptor(const Function* f) {
  if (!AreAnalysesValid(kAnalysisLoopAnalysis)) {
    ResetLoopAnalysis();
  }

  std::unordered_map<const Function*, LoopDescriptor>::iterator it =
      loop_descriptors_.find(f);
  if (it == loop_descriptors_.end()) {
    return &loop_descriptors_
                .emplace(std::make_pair(f, LoopDescriptor(this, f)))
                .first->second;
  }

  return &it->second;
}